

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O2

MPI_Request * __thiscall mxx::requests::add(requests *this)

{
  ompi_request_t *local_10;
  
  local_10 = (ompi_request_t *)0x0;
  std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
            ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&this->m_requests,&local_10)
  ;
  return (this->m_requests).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
}

Assistant:

MPI_Request& add() {
        m_requests.push_back(MPI_Request());
        return m_requests.back();
    }